

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

Ptr __thiscall core::image::float_to_byte_image(image *this,ConstPtr *image,float vmin,float vmax)

{
  bool bVar1;
  int iVar2;
  int height;
  int chans;
  invalid_argument *this_00;
  TypedImageBase<unsigned_char> *this_01;
  ImageBase *pIVar3;
  TypedImageBase<float> *this_02;
  element_type *this_03;
  float *pfVar4;
  element_type *this_04;
  uchar *puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar6;
  float fVar7;
  Ptr PVar8;
  int local_34;
  float value;
  int i;
  float local_20;
  float local_1c;
  float vmax_local;
  float vmin_local;
  ConstPtr *image_local;
  Ptr *img;
  
  local_20 = vmax;
  local_1c = vmin;
  _vmax_local = image;
  image_local = (ConstPtr *)this;
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  Image<unsigned_char>::create();
  this_01 = &std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<unsigned_char>;
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  iVar2 = ImageBase::width(pIVar3);
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  height = ImageBase::height(pIVar3);
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  chans = ImageBase::channels(pIVar3);
  TypedImageBase<unsigned_char>::allocate(this_01,iVar2,height,chans);
  local_34 = 0;
  while( true ) {
    this_02 = &std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<float>;
    iVar2 = TypedImageBase<float>::get_value_amount(this_02);
    if (iVar2 <= local_34) break;
    this_03 = std::
              __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    pfVar4 = Image<float>::at(this_03,local_34);
    pfVar4 = std::max<float>(&local_1c,pfVar4);
    pfVar4 = std::min<float>(&local_20,pfVar4);
    fVar6 = *pfVar4 - local_1c;
    fVar7 = local_20 - local_1c;
    this_04 = std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    puVar5 = Image<unsigned_char>::at(this_04,local_34);
    *puVar5 = (uchar)(int)((fVar6 * 255.0) / fVar7 + 0.5);
    local_34 = local_34 + 1;
  }
  PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ByteImage::Ptr
float_to_byte_image (FloatImage::ConstPtr image, float vmin, float vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        float value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0f * (value - vmin) / (vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5f);
    }
    return img;
}